

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::GeometryShaderMaxCombinedTextureUnitsTest
          (GeometryShaderMaxCombinedTextureUnitsTest *this,Context *context,ExtParameters *extParams
          ,char *name,char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderMaxCombinedTextureUnitsTest *this_local;
  
  GeometryShaderLimitsRenderingBase::GeometryShaderLimitsRenderingBase
            (&this->super_GeometryShaderLimitsRenderingBase,context,extParams,name,description);
  (this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxCombinedTextureUnitsTest_0326fca0;
  this->m_texture_width = 0;
  this->m_max_combined_texture_units = 0;
  this->m_max_fragment_texture_units = 0;
  this->m_max_geometry_texture_units = 0;
  this->m_max_vertex_texture_units = 0;
  this->m_min_texture_units = 0;
  this->m_n_fragment_texture_units = 0;
  this->m_n_geometry_texture_units = 0;
  this->m_n_texture_units = 0;
  this->m_n_vertex_texture_units = 0;
  std::__cxx11::string::string((string *)&this->m_n_fragment_texture_units_string);
  std::__cxx11::string::string((string *)&this->m_n_geometry_texture_units_string);
  std::__cxx11::string::string((string *)&this->m_n_vertex_texture_units_string);
  std::
  vector<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
  ::vector(&this->m_textures);
  return;
}

Assistant:

GeometryShaderMaxCombinedTextureUnitsTest::GeometryShaderMaxCombinedTextureUnitsTest(Context&			  context,
																					 const ExtParameters& extParams,
																					 const char*		  name,
																					 const char*		  description)
	: GeometryShaderLimitsRenderingBase(context, extParams, name, description)
	, m_texture_width(0)
	, m_max_combined_texture_units(0)
	, m_max_fragment_texture_units(0)
	, m_max_geometry_texture_units(0)
	, m_max_vertex_texture_units(0)
	, m_min_texture_units(0)
	, m_n_fragment_texture_units(0)
	, m_n_geometry_texture_units(0)
	, m_n_texture_units(0)
	, m_n_vertex_texture_units(0)
{
	/* Nothing to be done here */
}